

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall tinyxml2::XMLAttribute::~XMLAttribute(XMLAttribute *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__XMLAttribute_00396a70;
  StrPair::~StrPair((StrPair *)0x2a7d8a);
  StrPair::~StrPair((StrPair *)0x2a7d98);
  return;
}

Assistant:

virtual ~XMLAttribute()	{}